

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall gl4cts::GPUShaderFP64Test3::verifyResults(GPUShaderFP64Test3 *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar6;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  bool bVar10;
  byte local_9a1;
  MessageBuilder local_960;
  MessageBuilder local_7e0;
  MessageBuilder local_660;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  MessageBuilder local_1e0;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> image_data;
  bool vertex_shader_result;
  bool tess_eval_shader_result;
  bool tess_ctrl_shader_result;
  Functions *gl;
  bool geometry_shader_result;
  int *piStack_20;
  bool fragment_shader_result;
  GLint *feedback_data;
  GPUShaderFP64Test3 *this_local;
  long lVar5;
  
  piStack_20 = (int *)0x0;
  gl._7_1_ = 0;
  gl._6_1_ = 0;
  feedback_data = (GLint *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)local_50,1);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_color_texture_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x154a);
  pcVar1 = *(code **)(lVar5 + 0xaa0);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_50,0);
  (*pcVar1)(0xde1,0,0x8d94,0x1404,pvVar6);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x154d);
  piStack_20 = (int *)(**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1551);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_50,0);
  gl._7_1_ = *pvVar6 == 1;
  gl._6_1_ = *piStack_20 == 1;
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = piStack_20[1] == 1;
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = piStack_20[2] == 1;
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_1_ = piStack_20[3] == 1;
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x155c);
  local_9a1 = 0;
  if (((((gl._7_1_ & 1) != 0) && (local_9a1 = 0, (gl._6_1_ & 1) != 0)) &&
      (local_9a1 = 0,
      (image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) != 0)) &&
     (local_9a1 = 0,
     (image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._6_1_ & 1) != 0)) {
    local_9a1 = image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._5_1_;
  }
  bVar10 = (local_9a1 & 1) == 1;
  if (!bVar10) {
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_1e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [6])0x2c668b3);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_360,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_360,(char (*) [29])"Vertex shader stage result: ");
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(bool *)((long)&image_data.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_end_of_storage + 5));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_4e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_4e0,(char (*) [42])"Tesselation control shader stage result: ");
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(bool *)((long)&image_data.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_end_of_storage + 7));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_660,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_660,(char (*) [45])"Tesselation evaluation shader stage result: ");
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(bool *)((long)&image_data.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_end_of_storage + 6));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_660);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_7e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_7e0,(char (*) [31])"Geometry shader stage result: ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(bool *)((long)&gl + 6));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7e0);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<(&local_960,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_960,(char (*) [31])"Fragment shader stage result: ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(bool *)((long)&gl + 7));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_960);
  }
  this_local._7_1_ = bVar10;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test3::verifyResults() const
{
	glw::GLint*			  feedback_data			  = 0;
	bool				  fragment_shader_result  = false;
	bool				  geometry_shader_result  = false;
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	bool				  tess_ctrl_shader_result = false;
	bool				  tess_eval_shader_result = false;
	bool				  vertex_shader_result	= false;

	/* Prepare storage for testure data */
	std::vector<glw::GLint> image_data;
	image_data.resize(1);

	/* Get texture contents */
	gl.bindTexture(GL_TEXTURE_2D, m_color_texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RED_INTEGER, GL_INT, &image_data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	/* Get transform feedback data */
	feedback_data = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify results */
	fragment_shader_result  = (m_result_success == image_data[0]);
	geometry_shader_result  = (m_result_success == feedback_data[0]);
	tess_ctrl_shader_result = (m_result_success == feedback_data[1]);
	tess_eval_shader_result = (m_result_success == feedback_data[2]);
	vertex_shader_result	= (m_result_success == feedback_data[3]);

	/* Unmap transform feedback buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Set result */
	if (true != (fragment_shader_result && geometry_shader_result && tess_ctrl_shader_result &&
				 tess_eval_shader_result && vertex_shader_result))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error" << tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Vertex shader stage result: " << vertex_shader_result
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Tesselation control shader stage result: " << tess_ctrl_shader_result
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Tesselation evaluation shader stage result: " << tess_eval_shader_result
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Geometry shader stage result: " << geometry_shader_result
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Fragment shader stage result: " << fragment_shader_result
											<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}